

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivpatch1base_eval.cpp
# Opt level: O3

void embree::avx::evalGrid
               (SubdivPatch1Base *patch,uint x0,uint x1,uint y0,uint y1,uint swidth,uint sheight,
               float *grid_x,float *grid_y,float *grid_z,float *grid_u,float *grid_v,
               SubdivMesh *geom)

{
  ulong uVar1;
  undefined8 *puVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar4;
  size_t size;
  pointer pRVar5;
  uint *puVar6;
  BufferView<embree::Vec3fa> *pBVar7;
  char *pcVar8;
  long lVar9;
  code *pcVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined4 uVar26;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar27;
  uint uVar28;
  int iVar29;
  size_t i;
  float *pfVar31;
  void *pvVar32;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *Nx;
  int iVar33;
  int iVar34;
  uint uVar35;
  uint uVar36;
  long lVar37;
  float *pfVar38;
  int iVar39;
  uint uVar40;
  undefined4 *puVar41;
  float *pfVar42;
  uint uVar43;
  ulong uVar44;
  uint uVar45;
  ulong uVar46;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *paVar47;
  ulong uVar48;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *paVar49;
  uint uVar50;
  uint *puVar51;
  uint *puVar52;
  uint dwidth;
  bool bVar53;
  undefined1 auVar55 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar54 [16];
  undefined1 auVar61 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  float fVar72;
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  float fVar71;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 in_ZMM3 [64];
  float fVar76;
  float fVar81;
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  float fVar79;
  float fVar80;
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 in_ZMM4 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  float fVar91;
  float fVar96;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar94;
  float fVar95;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 in_ZMM7 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar110 [16];
  undefined1 auVar104 [32];
  undefined1 auVar102 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar103 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [64];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar127;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar128 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 in_ZMM13 [64];
  float in_register_0000159c;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 in_ZMM15 [64];
  uint x;
  vfloatx_conflict v;
  RTCDisplacementFunctionNArguments args;
  Vec3vfx_conflict normal;
  Vec3vfx_conflict vtx;
  vfloatx_conflict u;
  uint local_4f0c;
  uint local_4ee4;
  uint *local_4ed8;
  undefined1 local_4ea0 [136];
  long local_4e18;
  long local_4e10;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_4de0;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_4dc0;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *local_4da0;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *paStack_4d98;
  undefined1 *puStack_4d90;
  undefined1 (*pauStack_4d88) [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_4d80;
  float **ppfStack_4d78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paStack_4d70;
  float fStack_4d68;
  undefined4 uStack_4d64;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *local_3dc0;
  ulong local_3db8;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_3d80;
  undefined1 local_3d60 [32];
  undefined1 local_3d40 [126] [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *local_2d80;
  ulong local_2d78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2d40;
  uint uStack_2d30;
  uint uStack_2d2c;
  float *pfStack_2d28;
  float *local_2d20;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *paStack_2d18;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *paStack_2d10;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *paStack_2d08;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2d00;
  float *pfStack_2cf0;
  uint uStack_2ce8;
  undefined4 uStack_2ce4;
  undefined4 local_29dc [1575];
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1140;
  undefined4 local_1100;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_10c0 [128];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *local_c0;
  ulong local_b8;
  ulong uVar30;
  
  auVar56 = in_ZMM7._0_16_;
  uVar35 = x1 - x0;
  dwidth = uVar35 + 1;
  iVar39 = y1 - y0;
  uVar43 = iVar39 + 1;
  uVar28 = uVar43 * dwidth;
  uVar30 = (ulong)uVar28;
  uVar45 = uVar28 + 7;
  uVar50 = uVar45 >> 3;
  if (patch->type == '\x05') {
    local_3db8 = (ulong)(uVar28 + 8);
    Nx = *(anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 **)&(geom->super_Geometry).field_0x58;
    if (Nx == (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *)0x0) {
      local_3db8 = 0;
    }
    local_2d78 = local_3db8;
    local_b8 = local_3db8;
    if (local_3db8 < 0x401) {
      local_2d80 = &local_3d80;
      local_3dc0 = &local_4dc0;
      local_c0 = local_10c0;
    }
    else {
      size = local_3db8 * 4;
      local_4ea0._0_8_ = size;
      local_2d80 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *)alignedMalloc(size,0x40);
      local_3dc0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *)alignedMalloc(size,0x40);
      local_c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *)alignedMalloc(size,0x40);
    }
    auVar56 = in_ZMM10._0_16_;
    pRVar5 = (geom->patch_eval_trees).
             super__Vector_base<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref,_std::allocator<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((geom->patch_eval_trees).
        super__Vector_base<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref,_std::allocator<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref>_>
        ._M_impl.super__Vector_impl_data._M_finish == pRVar5) {
      puVar6 = *(uint **)&patch->patch_v[0][0].field_0;
      uVar35 = patch->time_;
      pBVar7 = (geom->vertices).items;
      lVar37 = 0x1c00;
      puVar41 = local_29dc;
      do {
        *(undefined4 **)(puVar41 + -0x49) = puVar41 + -0xc9;
        *(undefined4 **)(puVar41 + -0x19) = puVar41 + -0x39;
        *(undefined8 *)(puVar41 + -2) = 0;
        *puVar41 = 0;
        puVar41 = puVar41 + 0xe0;
        lVar37 = lVar37 + -0x380;
      } while (lVar37 != 0);
      local_1140 = &local_2d40;
      pcVar8 = pBVar7[uVar35].super_RawBufferView.ptr_ofs;
      uVar44 = (ulong)(uint)pBVar7[uVar35].super_RawBufferView.stride;
      local_4e10 = 0x40;
      local_4e18 = 0x280;
      uVar48 = 0;
      local_4ed8 = puVar6;
      do {
        if ((7 < uVar48) && (local_1140 == &local_2d40)) {
          alignedMalloc(0x3840,0x40);
          evalGrid();
          lVar37 = 0;
          do {
            GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::operator=
                      ((GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *)
                       ((long)local_1140 + lVar37),
                       (GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *)
                       ((long)&local_2d40 + lVar37));
            lVar37 = lVar37 + 0x380;
          } while (lVar37 != 0x1c00);
        }
        paVar27 = local_1140;
        uVar1 = uVar48 + 1;
        paVar3 = local_1140 + uVar48 * 0x38;
        paVar4 = local_1140 + uVar48 * 0x38;
        pfVar42 = paVar4->m128 + 0x10;
        *(undefined1 *)(paVar4->m128 + 0xd6) = 1;
        paVar4->m128[0xd2] = -NAN;
        uVar20 = *(undefined8 *)(pcVar8 + *local_4ed8 * uVar44);
        uVar21 = *(undefined8 *)(pcVar8 + *local_4ed8 * uVar44 + 8);
        *(float *)paVar4 = (float)(int)uVar20;
        *(int *)((long)paVar4 + 4) = (int)((ulong)uVar20 >> 0x20);
        *(undefined8 *)&(paVar4->field_1).z = uVar21;
        paVar4->m128[0xd3] = (float)local_4ed8[5];
        paVar4->m128[0xd5] = (float)local_4ed8[6];
        paVar4->m128[0xd4] = 0.0;
        pfVar38 = local_1140->m128 + uVar48 * 0xe0 + 0xa0;
        uVar46 = 0;
        fVar76 = -NAN;
        local_4ee4 = 0xffffffff;
        local_4f0c = 0xffffffff;
        auVar11._24_8_ = 0;
        auVar11._0_24_ = local_4ea0._8_24_;
        local_4ea0._0_32_ = auVar11 << 0x40;
        puVar51 = local_4ed8;
        do {
          uVar35 = puVar51[2];
          uVar36 = puVar51[1];
          auVar56 = vmaxss_avx(ZEXT416(puVar51[6]),ZEXT416((uint)paVar3[0x35].m128[0]));
          fVar79 = (float)puVar51[4];
          paVar3[0x35].m128[0] = auVar56._0_4_;
          bVar53 = puVar51[(long)(int)uVar36 * 8] < local_4f0c;
          if (bVar53) {
            fVar76 = (float)local_4ea0._0_4_;
          }
          uVar40 = (uint)uVar46;
          if (bVar53) {
            local_4ee4 = uVar40;
          }
          puVar52 = puVar51 + (long)(int)uVar36 * 8;
          if (bVar53) {
            local_4f0c = puVar51[(long)(int)uVar36 * 8];
          }
          if (uVar36 == uVar35) {
            fVar80 = 0.0;
            puVar51 = puVar52;
          }
          else {
            puVar51 = puVar51 + (long)(int)uVar35 * 8;
            fVar80 = 0.0;
            do {
              auVar11 = local_4ea0._0_32_;
              uVar20 = local_4ea0._0_8_;
              auVar56 = *(undefined1 (*) [16])(pcVar8 + *puVar52 * uVar44);
              local_4ea0._0_4_ = local_4ea0._0_4_ + 1;
              local_4ea0._4_4_ = 0;
              pfVar31 = *(float **)(paVar3 + 0x24);
              local_4ea0._8_24_ = auVar11._8_24_;
              if ((0x20 < (uint)local_4ea0._0_4_) && (pfVar31 == pfVar42)) {
                pvVar32 = alignedMalloc(0x800,0x10);
                *(void **)(paVar3 + 0x24) = pvVar32;
                lVar37 = 0;
                do {
                  lVar9 = *(long *)(paVar3 + 0x24);
                  puVar2 = (undefined8 *)((long)paVar27 + lVar37 + local_4e10);
                  uVar21 = puVar2[1];
                  *(undefined8 *)(lVar9 + lVar37) = *puVar2;
                  ((undefined8 *)(lVar9 + lVar37))[1] = uVar21;
                  lVar37 = lVar37 + 0x10;
                } while (lVar37 != 0x200);
                pfVar31 = *(float **)(paVar3 + 0x24);
              }
              *(undefined1 (*) [16])(pfVar31 + (uVar20 & 0xffffffff) * 4) = auVar56;
              fVar80 = (float)((int)fVar80 + 1);
              puVar52 = puVar52 + (long)(int)puVar52[1] * 8;
            } while (puVar52 != puVar51);
          }
          auVar11 = local_4ea0._0_32_;
          uVar35 = uVar40 + 1;
          pfVar31 = *(float **)(paVar3 + 0x30);
          if ((0x10 < uVar35) && (pfVar31 == pfVar38)) {
            pvVar32 = operator_new__(0x200);
            *(void **)(paVar3 + 0x30) = pvVar32;
            lVar37 = 0;
            do {
              *(undefined8 *)(*(long *)(paVar3 + 0x30) + lVar37 * 8) =
                   *(undefined8 *)((long)paVar27 + lVar37 * 8 + local_4e18);
              lVar37 = lVar37 + 1;
            } while (lVar37 != 0x10);
            pfVar31 = *(float **)(paVar3 + 0x30);
          }
          pfVar31[uVar46 * 2] = fVar80;
          pfVar31[uVar46 * 2 + 1] = fVar79;
          *(byte *)((long)paVar3 + 0x358) = *(byte *)((long)paVar3 + 0x358) & fVar80 == 2.8026e-45;
          if ((long)(int)puVar51[3] == 0) {
            uVar26 = local_4ea0._0_4_;
            if (*puVar51 < local_4f0c) {
              local_4f0c = *puVar51;
              fVar76 = (float)local_4ea0._0_4_;
              local_4ee4 = uVar35;
            }
            *(uint *)((long)paVar3 + 0x348) = uVar35;
            uVar40 = uVar40 + 2;
            pfVar31 = *(float **)(paVar3 + 0x30);
            if ((0x10 < uVar40) && (pfVar31 == pfVar38)) {
              pvVar32 = operator_new__(0x200);
              *(void **)(paVar3 + 0x30) = pvVar32;
              lVar37 = 0;
              do {
                *(undefined8 *)(*(long *)(paVar3 + 0x30) + lVar37 * 8) =
                     *(undefined8 *)((long)paVar27 + lVar37 * 8 + local_4e18);
                lVar37 = lVar37 + 1;
              } while (lVar37 != 0x10);
              pfVar31 = *(float **)(paVar3 + 0x30);
            }
            (pfVar31 + (ulong)uVar35 * 2)[0] = 2.8026e-45;
            (pfVar31 + (ulong)uVar35 * 2)[1] = INFINITY;
            uVar20 = *(undefined8 *)(pcVar8 + *puVar51 * uVar44);
            uVar21 = *(undefined8 *)(pcVar8 + *puVar51 * uVar44 + 8);
            uVar35 = uVar26 + 1;
            pfVar31 = *(float **)(paVar3 + 0x24);
            if ((0x20 < uVar35) && (pfVar31 == pfVar42)) {
              pvVar32 = alignedMalloc(0x800,0x10);
              *(void **)(paVar3 + 0x24) = pvVar32;
              lVar37 = 0;
              do {
                lVar9 = *(long *)(paVar3 + 0x24);
                puVar2 = (undefined8 *)((long)paVar27 + lVar37 + local_4e10);
                uVar22 = puVar2[1];
                *(undefined8 *)(lVar9 + lVar37) = *puVar2;
                ((undefined8 *)(lVar9 + lVar37))[1] = uVar22;
                lVar37 = lVar37 + 0x10;
              } while (lVar37 != 0x200);
              pfVar31 = *(float **)(paVar3 + 0x24);
            }
            *(undefined8 *)(pfVar31 + (local_4ea0._0_8_ & 0xffffffff) * 4) = uVar20;
            *(undefined8 *)(pfVar31 + (local_4ea0._0_8_ & 0xffffffff) * 4 + 2) = uVar21;
            local_4ea0._0_4_ = uVar26 + 2;
            local_4ea0._4_4_ = 0;
            pfVar31 = *(float **)(paVar3 + 0x24);
            local_4ea0._8_24_ = auVar11._8_24_;
            if ((0x20 < (uint)local_4ea0._0_4_) && (pfVar31 == pfVar42)) {
              pvVar32 = alignedMalloc(0x800,0x10);
              *(void **)(paVar3 + 0x24) = pvVar32;
              lVar37 = 0;
              do {
                lVar9 = *(long *)(paVar3 + 0x24);
                puVar2 = (undefined8 *)((long)paVar27 + lVar37 + local_4e10);
                uVar20 = puVar2[1];
                *(undefined8 *)(lVar9 + lVar37) = *puVar2;
                ((undefined8 *)(lVar9 + lVar37))[1] = uVar20;
                lVar37 = lVar37 + 0x10;
              } while (lVar37 != 0x200);
              pfVar31 = *(float **)(paVar3 + 0x24);
            }
            *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar31 + (ulong)uVar35 * 4) = *paVar3;
            uVar35 = local_4ed8[3];
            puVar52 = local_4ed8;
            if (uVar35 == 0) break;
            do {
              lVar37 = (long)(int)uVar35;
              puVar51 = puVar52 + lVar37 * 8 + (long)(int)puVar52[lVar37 * 8 + 1] * 8;
              uVar35 = puVar52[lVar37 * 8 + (long)(int)puVar52[lVar37 * 8 + 1] * 8 + 3];
              puVar52 = puVar51;
            } while (uVar35 != 0);
          }
          else {
            puVar51 = puVar51 + (long)(int)puVar51[3] * 8;
            uVar40 = uVar35;
          }
          uVar46 = (ulong)uVar40;
        } while (puVar51 != local_4ed8);
        auVar56 = in_ZMM10._0_16_;
        *(int *)((long)paVar3 + 0x344) = local_4ea0._0_4_;
        *(uint *)(paVar3 + 0x34) = uVar40;
        *(uint *)((long)paVar3 + 0x364) = local_4f0c;
        *(uint *)((long)paVar3 + 0x35c) = local_4ee4;
        paVar3[0x36].m128[0] = fVar76;
        if (0xe < uVar48) break;
        local_4ed8 = local_4ed8 + (long)(int)local_4ed8[1] * 8;
        local_4e10 = local_4e10 + 0x380;
        local_4e18 = local_4e18 + 0x380;
        uVar48 = uVar1;
      } while (local_4ed8 != puVar6);
      local_1100 = (undefined4)uVar1;
      pfVar38 = (float *)0x0;
      if ((patch->flags & 0x10) != 0) {
        pfVar38 = patch->level;
      }
      paVar47 = Nx;
      paVar49 = Nx;
      if (Nx != (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *)0x0) {
        Nx = local_2d80;
        paVar47 = local_c0;
        paVar49 = local_3dc0;
      }
      feature_adaptive_eval_grid<embree::avx::FeatureAdaptiveEvalGrid,embree::GeneralCatmullClarkPatchT<embree::Vec3fa,embree::Vec3fa>>
                ((GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa> *)&local_2d40.field_1,
                 (uint)patch->patch_v[0][0].field_0.m128[2],pfVar38,x0,x1,y0,y1,swidth,sheight,
                 grid_x,grid_y,grid_z,grid_u,grid_v,Nx->v,paVar49->v,paVar47->v,dwidth,uVar43);
      GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>::~GeneralCatmullClarkPatchT
                ((GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa> *)&local_2d40.field_1);
    }
    else {
      pfVar38 = (float *)0x0;
      if ((patch->flags & 0x10) != 0) {
        pfVar38 = patch->level;
      }
      paVar47 = Nx;
      paVar49 = Nx;
      if (Nx != (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *)0x0) {
        Nx = local_3dc0;
        paVar47 = local_2d80;
        paVar49 = local_c0;
      }
      feature_adaptive_eval_grid<embree::avx::PatchEvalGrid,embree::PatchT<embree::Vec3fa,embree::Vec3fa>::Ref>
                (pRVar5 + (ulong)(patch->prim * (geom->super_Geometry).numTimeSteps + patch->time_)
                          * 8,(uint)patch->patch_v[0][0].field_0.m128[2],pfVar38,x0,x1,y0,y1,swidth,
                 sheight,grid_x,grid_y,grid_z,grid_u,grid_v,paVar47->v,Nx->v,paVar49->v,dwidth,
                 uVar43);
    }
    if (7 < uVar45) {
      auVar56 = ZEXT416((uint)((float)patch->u[0] * 0.00012207031));
      auVar57 = vshufps_avx(auVar56,auVar56,0);
      auVar56 = ZEXT416((uint)((float)patch->u[3] * 0.00012207031));
      auVar102 = vshufps_avx(auVar56,auVar56,0);
      auVar56 = ZEXT416((uint)((float)patch->u[1] * 0.00012207031));
      auVar113 = vshufps_avx(auVar56,auVar56,0);
      auVar56 = ZEXT416((uint)((float)patch->u[2] * 0.00012207031));
      auVar123 = vshufps_avx(auVar56,auVar56,0);
      auVar56 = ZEXT416((uint)((float)patch->v[0] * 0.00012207031));
      auVar100 = vshufps_avx(auVar56,auVar56,0);
      auVar56 = ZEXT416((uint)((float)patch->v[3] * 0.00012207031));
      auVar110 = vshufps_avx(auVar56,auVar56,0);
      auVar56 = ZEXT416((uint)((float)patch->v[1] * 0.00012207031));
      auVar129 = vshufps_avx(auVar56,auVar56,0);
      auVar56 = ZEXT416((uint)((float)patch->v[2] * 0.00012207031));
      auVar103 = vshufps_avx(auVar56,auVar56,0);
      lVar37 = 0;
      auVar104._8_4_ = 0x3f800000;
      auVar104._0_8_ = 0x3f8000003f800000;
      auVar104._12_4_ = 0x3f800000;
      auVar104._16_4_ = 0x3f800000;
      auVar104._20_4_ = 0x3f800000;
      auVar104._24_4_ = 0x3f800000;
      auVar104._28_4_ = 0x3f800000;
      do {
        auVar11 = *(undefined1 (*) [32])((long)grid_u + lVar37);
        auVar62 = *(undefined1 (*) [32])((long)grid_v + lVar37);
        auVar64 = vsubps_avx(auVar104,auVar11);
        auVar65 = vsubps_avx(auVar104,auVar62);
        fVar79 = auVar62._0_4_;
        fVar80 = auVar62._4_4_;
        fVar81 = auVar62._8_4_;
        fVar82 = auVar62._12_4_;
        fVar83 = auVar62._16_4_;
        fVar84 = auVar62._20_4_;
        fVar91 = auVar62._24_4_;
        fVar94 = auVar65._0_4_;
        fVar95 = auVar65._4_4_;
        fVar96 = auVar65._8_4_;
        fVar97 = auVar65._12_4_;
        fVar98 = auVar65._16_4_;
        fVar99 = auVar65._20_4_;
        fVar127 = auVar65._24_4_;
        fVar76 = in_ZMM15._28_4_;
        auVar132._0_4_ =
             auVar64._0_4_ * (fVar79 * auVar102._0_4_ + fVar94 * auVar57._0_4_) +
             auVar11._0_4_ * (fVar79 * auVar123._0_4_ + fVar94 * auVar113._0_4_);
        auVar132._4_4_ =
             auVar64._4_4_ * (fVar80 * auVar102._4_4_ + fVar95 * auVar57._4_4_) +
             auVar11._4_4_ * (fVar80 * auVar123._4_4_ + fVar95 * auVar113._4_4_);
        auVar132._8_4_ =
             auVar64._8_4_ * (fVar81 * auVar102._8_4_ + fVar96 * auVar57._8_4_) +
             auVar11._8_4_ * (fVar81 * auVar123._8_4_ + fVar96 * auVar113._8_4_);
        auVar132._12_4_ =
             auVar64._12_4_ * (fVar82 * auVar102._12_4_ + fVar97 * auVar57._12_4_) +
             auVar11._12_4_ * (fVar82 * auVar123._12_4_ + fVar97 * auVar113._12_4_);
        auVar132._16_4_ =
             auVar64._16_4_ * (fVar83 * auVar102._0_4_ + fVar98 * auVar57._0_4_) +
             auVar11._16_4_ * (fVar83 * auVar123._0_4_ + fVar98 * auVar113._0_4_);
        auVar132._20_4_ =
             auVar64._20_4_ * (fVar84 * auVar102._4_4_ + fVar99 * auVar57._4_4_) +
             auVar11._20_4_ * (fVar84 * auVar123._4_4_ + fVar99 * auVar113._4_4_);
        auVar132._24_4_ =
             auVar64._24_4_ * (fVar91 * auVar102._8_4_ + fVar127 * auVar57._8_4_) +
             auVar11._24_4_ * (fVar91 * auVar123._8_4_ + fVar127 * auVar113._8_4_);
        auVar132._28_4_ = in_ZMM13._28_4_ + in_register_0000159c + in_register_0000159c + fVar76;
        in_ZMM13 = ZEXT3264(auVar132);
        fVar133 = fVar94 * auVar100._0_4_;
        fVar134 = fVar95 * auVar100._4_4_;
        fVar135 = fVar96 * auVar100._8_4_;
        fVar136 = fVar97 * auVar100._12_4_;
        fVar137 = fVar98 * auVar100._0_4_;
        fVar71 = fVar99 * auVar100._4_4_;
        fVar72 = fVar127 * auVar100._8_4_;
        in_ZMM15 = ZEXT3264(CONCAT428(fVar76,CONCAT424(fVar72,CONCAT420(fVar71,CONCAT416(fVar137,
                                                  CONCAT412(fVar136,CONCAT48(fVar135,CONCAT44(
                                                  fVar134,fVar133))))))));
        in_register_0000159c = in_register_0000159c + fVar76 + fVar76;
        auVar56._0_4_ = auVar64._0_4_ * (fVar79 * auVar110._0_4_ + fVar133);
        auVar56._4_4_ = auVar64._4_4_ * (fVar80 * auVar110._4_4_ + fVar134);
        auVar56._8_4_ = auVar64._8_4_ * (fVar81 * auVar110._8_4_ + fVar135);
        auVar56._12_4_ = auVar64._12_4_ * (fVar82 * auVar110._12_4_ + fVar136);
        *(undefined1 (*) [32])((long)grid_u + lVar37) = auVar132;
        pfVar38 = (float *)((long)grid_v + lVar37);
        *pfVar38 = auVar56._0_4_ +
                   auVar11._0_4_ * (fVar79 * auVar103._0_4_ + fVar94 * auVar129._0_4_);
        pfVar38[1] = auVar56._4_4_ +
                     auVar11._4_4_ * (fVar80 * auVar103._4_4_ + fVar95 * auVar129._4_4_);
        pfVar38[2] = auVar56._8_4_ +
                     auVar11._8_4_ * (fVar81 * auVar103._8_4_ + fVar96 * auVar129._8_4_);
        pfVar38[3] = auVar56._12_4_ +
                     auVar11._12_4_ * (fVar82 * auVar103._12_4_ + fVar97 * auVar129._12_4_);
        pfVar38[4] = auVar64._16_4_ * (fVar83 * auVar110._0_4_ + fVar137) +
                     auVar11._16_4_ * (fVar83 * auVar103._0_4_ + fVar98 * auVar129._0_4_);
        pfVar38[5] = auVar64._20_4_ * (fVar84 * auVar110._4_4_ + fVar71) +
                     auVar11._20_4_ * (fVar84 * auVar103._4_4_ + fVar99 * auVar129._4_4_);
        pfVar38[6] = auVar64._24_4_ * (fVar91 * auVar110._8_4_ + fVar72) +
                     auVar11._24_4_ * (fVar91 * auVar103._8_4_ + fVar127 * auVar129._8_4_);
        pfVar38[7] = auVar62._28_4_ + auVar65._28_4_ + auVar11._28_4_;
        lVar37 = lVar37 + 0x20;
      } while ((ulong)(uVar50 + (uVar50 == 0)) << 5 != lVar37);
    }
    pcVar10 = *(code **)&(geom->super_Geometry).field_0x58;
    if (pcVar10 != (code *)0x0) {
      local_2d40._0_8_ = (geom->super_Geometry).userPtr;
      uStack_2d30 = patch->prim;
      uStack_2d2c = patch->time_;
      pfStack_2d28 = grid_u;
      local_2d20 = grid_v;
      paStack_2d18 = local_2d80;
      paStack_2d10 = local_3dc0;
      paStack_2d08 = local_c0;
      local_2d00._0_8_ = grid_x;
      local_2d00._8_8_ = grid_y;
      pfStack_2cf0 = grid_z;
      local_2d40._8_8_ = geom;
      uStack_2ce8 = uVar28;
      (*pcVar10)();
    }
    auVar104 = _DAT_01fb7040;
    auVar11 = _DAT_01fb0e40;
    if (uVar28 < (uVar45 & 0xfffffff8)) {
      uVar28 = uVar28 - 1;
      lVar37 = (uVar45 & 0xfffffff8) - uVar30;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = lVar37 - 1;
      auVar57 = vpshufd_avx(auVar57,0x44);
      fVar76 = grid_u[uVar28];
      auVar62._4_4_ = fVar76;
      auVar62._0_4_ = fVar76;
      auVar62._8_4_ = fVar76;
      auVar62._12_4_ = fVar76;
      auVar62._16_4_ = fVar76;
      auVar62._20_4_ = fVar76;
      auVar62._24_4_ = fVar76;
      auVar62._28_4_ = fVar76;
      fVar76 = grid_v[uVar28];
      auVar64._4_4_ = fVar76;
      auVar64._0_4_ = fVar76;
      auVar64._8_4_ = fVar76;
      auVar64._12_4_ = fVar76;
      auVar64._16_4_ = fVar76;
      auVar64._20_4_ = fVar76;
      auVar64._24_4_ = fVar76;
      auVar64._28_4_ = fVar76;
      fVar76 = grid_x[uVar28];
      auVar65._4_4_ = fVar76;
      auVar65._0_4_ = fVar76;
      auVar65._8_4_ = fVar76;
      auVar65._12_4_ = fVar76;
      auVar65._16_4_ = fVar76;
      auVar65._20_4_ = fVar76;
      auVar65._24_4_ = fVar76;
      auVar65._28_4_ = fVar76;
      fVar76 = grid_y[uVar28];
      auVar70._4_4_ = fVar76;
      auVar70._0_4_ = fVar76;
      auVar70._8_4_ = fVar76;
      auVar70._12_4_ = fVar76;
      auVar70._16_4_ = fVar76;
      auVar70._20_4_ = fVar76;
      auVar70._24_4_ = fVar76;
      auVar70._28_4_ = fVar76;
      fVar76 = grid_z[uVar28];
      auVar78._4_4_ = fVar76;
      auVar78._0_4_ = fVar76;
      auVar78._8_4_ = fVar76;
      auVar78._12_4_ = fVar76;
      auVar78._16_4_ = fVar76;
      auVar78._20_4_ = fVar76;
      auVar78._24_4_ = fVar76;
      auVar78._28_4_ = fVar76;
      uVar44 = 0;
      uVar48 = auVar57._0_8_;
      auVar102._0_8_ = uVar48 ^ 0x8000000000000000;
      auVar102._8_4_ = auVar57._8_4_;
      uVar43 = auVar57._12_4_;
      auVar102._12_4_ = uVar43 ^ 0x80000000;
      auVar113._0_8_ = uVar48 ^ 0x8000000000000000;
      auVar113._8_4_ = auVar102._8_4_;
      auVar113._12_4_ = uVar43 ^ 0x80000000;
      auVar56 = vpcmpeqd_avx(auVar56,auVar56);
      auVar123._0_8_ = uVar48 ^ 0x8000000000000000;
      auVar123._8_4_ = auVar102._8_4_;
      auVar123._12_4_ = uVar43 ^ 0x80000000;
      do {
        auVar100._8_8_ = 0;
        auVar100._0_8_ = uVar44;
        auVar57 = vpshufd_avx(auVar100,0x44);
        auVar125._16_16_ = auVar57;
        auVar125._0_16_ = auVar57;
        auVar132 = vorps_avx(auVar125,auVar11);
        auVar125 = vorps_avx(auVar125,auVar104);
        auVar103._0_8_ = auVar125._16_8_ ^ 0x8000000000000000;
        auVar103._8_4_ = auVar125._24_4_;
        auVar103._12_4_ = auVar125._28_4_ ^ 0x80000000;
        auVar57 = vpcmpgtq_avx(auVar103,auVar102);
        auVar110._0_8_ = auVar125._0_8_ ^ 0x8000000000000000;
        auVar110._8_4_ = auVar125._8_4_;
        auVar110._12_4_ = auVar125._12_4_ ^ 0x80000000;
        auVar100 = vpcmpgtq_avx(auVar110,auVar113);
        auVar57 = vpackssdw_avx(auVar100,auVar57);
        auVar128._0_8_ = auVar132._16_8_ ^ 0x8000000000000000;
        auVar128._8_4_ = auVar132._24_4_;
        auVar128._12_4_ = auVar132._28_4_ ^ 0x80000000;
        auVar100 = vpcmpgtq_avx(auVar128,auVar102);
        auVar129._0_8_ = auVar132._0_8_ ^ 0x8000000000000000;
        auVar129._8_4_ = auVar132._8_4_;
        auVar129._12_4_ = auVar132._12_4_ ^ 0x80000000;
        auVar110 = vpcmpgtq_avx(auVar129,auVar123);
        auVar100 = vpackssdw_avx(auVar110,auVar100);
        auVar57 = vpackssdw_avx(auVar100 ^ auVar56,auVar57 ^ auVar56);
        auVar100 = vpmovsxwd_avx(auVar57);
        auVar57 = vpunpckhwd_avx(auVar57,auVar57);
        auVar126._16_16_ = auVar57;
        auVar126._0_16_ = auVar100;
        auVar132 = vmaskmovps_avx(auVar126,auVar62);
        *(undefined1 (*) [32])(grid_u + uVar30 + uVar44) = auVar132;
        auVar132 = vmaskmovps_avx(auVar126,auVar64);
        *(undefined1 (*) [32])(grid_v + uVar30 + uVar44) = auVar132;
        auVar132 = vmaskmovps_avx(auVar126,auVar65);
        *(undefined1 (*) [32])(grid_x + uVar30 + uVar44) = auVar132;
        auVar132 = vmaskmovps_avx(auVar126,auVar70);
        *(undefined1 (*) [32])(grid_y + uVar30 + uVar44) = auVar132;
        auVar132 = vmaskmovps_avx(auVar126,auVar78);
        *(undefined1 (*) [32])(grid_z + uVar30 + uVar44) = auVar132;
        uVar44 = uVar44 + 8;
      } while ((lVar37 + 7U & 0xfffffffffffffff8) != uVar44);
    }
    if (local_c0 != local_10c0) {
      alignedFree(local_c0);
    }
    if (local_3dc0 != &local_4dc0) {
      alignedFree(local_3dc0);
    }
    if (local_2d80 != &local_3d80) {
      alignedFree(local_2d80);
    }
  }
  else {
    if (uVar43 != 0) {
      auVar56 = vpshufd_avx(ZEXT416(swidth),0);
      auVar113 = vpcmpeqd_avx(ZEXT416(swidth),ZEXT416(swidth));
      auVar57 = vpaddd_avx(auVar56,auVar113);
      auVar56 = vpshufd_avx(ZEXT416(sheight),0);
      auVar102 = vpaddd_avx(auVar56,auVar113);
      auVar67._16_16_ = auVar57;
      auVar67._0_16_ = auVar57;
      auVar11 = vcvtdq2ps_avx(auVar67);
      auVar104 = vrcpps_avx(auVar11);
      fVar76 = auVar104._0_4_;
      auVar109._0_4_ = fVar76 * auVar11._0_4_;
      fVar79 = auVar104._4_4_;
      auVar109._4_4_ = fVar79 * auVar11._4_4_;
      fVar80 = auVar104._8_4_;
      auVar109._8_4_ = fVar80 * auVar11._8_4_;
      fVar81 = auVar104._12_4_;
      auVar109._12_4_ = fVar81 * auVar11._12_4_;
      fVar82 = auVar104._16_4_;
      auVar109._16_4_ = fVar82 * auVar11._16_4_;
      fVar83 = auVar104._20_4_;
      auVar109._20_4_ = fVar83 * auVar11._20_4_;
      fVar84 = auVar104._24_4_;
      auVar109._28_36_ = in_ZMM5._28_36_;
      auVar109._24_4_ = fVar84 * auVar11._24_4_;
      auVar68._8_4_ = 0x3f800000;
      auVar68._0_8_ = 0x3f8000003f800000;
      auVar68._12_4_ = 0x3f800000;
      auVar68._16_4_ = 0x3f800000;
      auVar68._20_4_ = 0x3f800000;
      auVar68._24_4_ = 0x3f800000;
      auVar68._28_4_ = 0x3f800000;
      in_ZMM3 = ZEXT3264(auVar68);
      auVar64 = vsubps_avx(auVar68,auVar109._0_32_);
      auVar90._16_16_ = auVar102;
      auVar90._0_16_ = auVar102;
      auVar11 = vcvtdq2ps_avx(auVar90);
      auVar62 = vrcpps_avx(auVar11);
      fVar76 = fVar76 + fVar76 * auVar64._0_4_;
      fVar79 = fVar79 + fVar79 * auVar64._4_4_;
      fVar80 = fVar80 + fVar80 * auVar64._8_4_;
      fVar81 = fVar81 + fVar81 * auVar64._12_4_;
      fVar82 = fVar82 + fVar82 * auVar64._16_4_;
      fVar83 = fVar83 + fVar83 * auVar64._20_4_;
      fVar84 = fVar84 + fVar84 * auVar64._24_4_;
      in_ZMM4 = ZEXT3264(CONCAT428(auVar104._28_4_ + auVar64._28_4_,
                                   CONCAT424(fVar84,CONCAT420(fVar83,CONCAT416(fVar82,CONCAT412(
                                                  fVar81,CONCAT48(fVar80,CONCAT44(fVar79,fVar76)))))
                                            )));
      fVar91 = auVar62._0_4_;
      fVar94 = auVar62._4_4_;
      auVar12._4_4_ = fVar94 * auVar11._4_4_;
      auVar12._0_4_ = fVar91 * auVar11._0_4_;
      fVar95 = auVar62._8_4_;
      auVar12._8_4_ = fVar95 * auVar11._8_4_;
      fVar96 = auVar62._12_4_;
      auVar12._12_4_ = fVar96 * auVar11._12_4_;
      fVar97 = auVar62._16_4_;
      auVar12._16_4_ = fVar97 * auVar11._16_4_;
      fVar98 = auVar62._20_4_;
      auVar12._20_4_ = fVar98 * auVar11._20_4_;
      fVar99 = auVar62._24_4_;
      auVar12._24_4_ = fVar99 * auVar11._24_4_;
      auVar12._28_4_ = auVar64._28_4_;
      auVar11 = vsubps_avx(auVar68,auVar12);
      auVar123 = vpshufd_avx(ZEXT416(x0),0);
      auVar56 = vpshufd_avx(ZEXT416(y0),0);
      auVar109 = ZEXT1664((undefined1  [16])0x0);
      lVar37 = 0;
      auVar117._8_4_ = 8;
      auVar117._0_8_ = 0x800000008;
      auVar117._12_4_ = 8;
      iVar33 = 0;
      do {
        auVar100 = auVar109._0_16_;
        auVar110 = auVar109._16_16_;
        if (dwidth != 0) {
          auVar129 = vpcmpgtd_avx(auVar102,auVar100);
          auVar129 = vpackssdw_avx(auVar129,auVar129);
          auVar103 = vpcmpgtd_avx(auVar102,auVar110);
          auVar129 = vpunpcklwd_avx(auVar129,auVar129);
          auVar124._16_16_ = auVar103;
          auVar124._0_16_ = auVar129;
          auVar129 = vpaddd_avx(auVar100,auVar56);
          auVar103 = vpaddd_avx(auVar110,auVar56);
          auVar130._16_16_ = auVar103;
          auVar130._0_16_ = auVar129;
          auVar104 = vcvtdq2ps_avx(auVar130);
          auVar13._4_4_ = auVar104._4_4_ * (fVar94 + fVar94 * auVar11._4_4_);
          auVar13._0_4_ = auVar104._0_4_ * (fVar91 + fVar91 * auVar11._0_4_);
          auVar13._8_4_ = auVar104._8_4_ * (fVar95 + fVar95 * auVar11._8_4_);
          auVar13._12_4_ = auVar104._12_4_ * (fVar96 + fVar96 * auVar11._12_4_);
          auVar13._16_4_ = auVar104._16_4_ * (fVar97 + fVar97 * auVar11._16_4_);
          auVar13._20_4_ = auVar104._20_4_ * (fVar98 + fVar98 * auVar11._20_4_);
          auVar13._24_4_ = auVar104._24_4_ * (fVar99 + fVar99 * auVar11._24_4_);
          auVar13._28_4_ = auVar104._28_4_;
          auVar104 = vblendvps_avx(auVar68,auVar13,auVar124);
          uVar48 = 0;
          auVar131 = _DAT_01fe9900;
          do {
            auVar128 = auVar131._0_16_;
            auVar129 = vpcmpgtd_avx(auVar57,auVar128);
            auVar129 = vpackssdw_avx(auVar129,auVar129);
            auVar54 = auVar131._16_16_;
            auVar103 = vpcmpgtd_avx(auVar57,auVar54);
            auVar129 = vpunpcklwd_avx(auVar129,auVar129);
            auVar114._16_16_ = auVar103;
            auVar114._0_16_ = auVar129;
            auVar129 = vpaddd_avx(auVar128,auVar123);
            auVar103 = vpaddd_avx(auVar54,auVar123);
            auVar88._16_16_ = auVar103;
            auVar88._0_16_ = auVar129;
            auVar62 = vcvtdq2ps_avx(auVar88);
            auVar14._4_4_ = fVar79 * auVar62._4_4_;
            auVar14._0_4_ = fVar76 * auVar62._0_4_;
            auVar14._8_4_ = fVar80 * auVar62._8_4_;
            auVar14._12_4_ = fVar81 * auVar62._12_4_;
            auVar14._16_4_ = fVar82 * auVar62._16_4_;
            auVar14._20_4_ = fVar83 * auVar62._20_4_;
            auVar14._24_4_ = fVar84 * auVar62._24_4_;
            auVar14._28_4_ = auVar62._28_4_;
            auVar62 = vblendvps_avx(auVar68,auVar14,auVar114);
            uVar43 = (int)lVar37 + (int)uVar48;
            *(undefined1 (*) [32])(grid_u + uVar43) = auVar62;
            *(undefined1 (*) [32])(grid_v + uVar43) = auVar104;
            uVar48 = uVar48 + 8;
            auVar129 = vpaddd_avx(auVar54,auVar117);
            auVar103 = vpaddd_avx(auVar128,auVar117);
            auVar131._16_16_ = auVar129;
            auVar131._0_16_ = auVar103;
          } while (uVar48 < dwidth);
        }
        auVar110 = vpsubd_avx(auVar110,auVar113);
        auVar100 = vpsubd_avx(auVar100,auVar113);
        auVar109 = ZEXT3264(CONCAT1616(auVar110,auVar100));
        lVar37 = lVar37 + (ulong)dwidth;
        bVar53 = iVar33 != iVar39;
        iVar33 = iVar33 + 1;
      } while (bVar53);
    }
    auVar104 = _DAT_01fb7040;
    auVar11 = _DAT_01fb0e40;
    if (uVar28 < (uVar45 & 0xfffffff8)) {
      lVar37 = (uVar45 & 0xfffffff8) - uVar30;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = lVar37 - 1;
      auVar57 = vpshufd_avx(auVar54,0x44);
      fVar76 = grid_u[uVar28 - 1];
      auVar61._4_4_ = fVar76;
      auVar61._0_4_ = fVar76;
      auVar61._8_4_ = fVar76;
      auVar61._12_4_ = fVar76;
      auVar61._16_4_ = fVar76;
      auVar61._20_4_ = fVar76;
      auVar61._24_4_ = fVar76;
      auVar61._28_4_ = fVar76;
      fVar76 = grid_v[uVar28 - 1];
      auVar63._4_4_ = fVar76;
      auVar63._0_4_ = fVar76;
      auVar63._8_4_ = fVar76;
      auVar63._12_4_ = fVar76;
      auVar63._16_4_ = fVar76;
      auVar63._20_4_ = fVar76;
      auVar63._24_4_ = fVar76;
      auVar63._28_4_ = fVar76;
      uVar44 = 0;
      in_ZMM3 = ZEXT3264(_DAT_01fb7040);
      in_ZMM4 = ZEXT1664(CONCAT88(0x8000000000000000,0x8000000000000000));
      uVar48 = auVar57._0_8_;
      auVar85._0_8_ = uVar48 ^ 0x8000000000000000;
      auVar85._8_4_ = auVar57._8_4_;
      uVar43 = auVar57._12_4_;
      auVar85._12_4_ = uVar43 ^ 0x80000000;
      auVar89._0_8_ = uVar48 ^ 0x8000000000000000;
      auVar89._8_4_ = auVar85._8_4_;
      auVar89._12_4_ = uVar43 ^ 0x80000000;
      auVar56 = vpcmpeqd_avx(auVar56,auVar56);
      auVar101._0_8_ = uVar48 ^ 0x8000000000000000;
      auVar101._8_4_ = auVar85._8_4_;
      auVar101._12_4_ = uVar43 ^ 0x80000000;
      do {
        auVar111._8_8_ = 0;
        auVar111._0_8_ = uVar44;
        auVar57 = vpshufd_avx(auVar111,0x44);
        auVar115._16_16_ = auVar57;
        auVar115._0_16_ = auVar57;
        auVar62 = vorps_avx(auVar115,auVar11);
        auVar64 = vorps_avx(auVar115,auVar104);
        auVar121._0_8_ = auVar64._16_8_ ^ 0x8000000000000000;
        auVar121._8_4_ = auVar64._24_4_;
        auVar121._12_4_ = auVar64._28_4_ ^ 0x80000000;
        auVar57 = vpcmpgtq_avx(auVar121,auVar85);
        auVar112._0_8_ = auVar64._0_8_ ^ 0x8000000000000000;
        auVar112._8_4_ = auVar64._8_4_;
        auVar112._12_4_ = auVar64._12_4_ ^ 0x80000000;
        auVar102 = vpcmpgtq_avx(auVar112,auVar89);
        auVar57 = vpackssdw_avx(auVar102,auVar57);
        auVar122._0_8_ = auVar62._16_8_ ^ 0x8000000000000000;
        auVar122._8_4_ = auVar62._24_4_;
        auVar122._12_4_ = auVar62._28_4_ ^ 0x80000000;
        auVar102 = vpcmpgtq_avx(auVar122,auVar85);
        auVar118._0_8_ = auVar62._0_8_ ^ 0x8000000000000000;
        auVar118._8_4_ = auVar62._8_4_;
        auVar118._12_4_ = auVar62._12_4_ ^ 0x80000000;
        auVar113 = vpcmpgtq_avx(auVar118,auVar101);
        auVar102 = vpackssdw_avx(auVar113,auVar102);
        auVar57 = vpackssdw_avx(auVar102 ^ auVar56,auVar57 ^ auVar56);
        auVar102 = vpmovsxwd_avx(auVar57);
        auVar57 = vpunpckhwd_avx(auVar57,auVar57);
        auVar116._16_16_ = auVar57;
        auVar116._0_16_ = auVar102;
        auVar62 = vmaskmovps_avx(auVar116,auVar61);
        *(undefined1 (*) [32])(grid_u + uVar30 + uVar44) = auVar62;
        auVar62 = vmaskmovps_avx(auVar116,auVar63);
        *(undefined1 (*) [32])(grid_v + uVar30 + uVar44) = auVar62;
        uVar44 = uVar44 + 8;
      } while ((lVar37 + 7U & 0xfffffffffffffff8) != uVar44);
    }
    auVar11 = _DAT_01fe9900;
    if ((patch->flags & 0x10) != 0) {
      fVar76 = patch->level[1];
      uVar36 = x1 + 1;
      fVar79 = patch->level[2];
      uVar43 = (uint)(long)patch->level[0];
      uVar28 = (uint)(long)fVar79;
      fVar80 = patch->level[3];
      if (uVar43 + 1 < swidth && y0 == 0) {
        if (x0 <= x1) {
          auVar58._0_4_ = (float)((long)patch->level[0] & 0xffffffff);
          auVar58._4_8_ = SUB128(ZEXT812(0),4);
          auVar58._12_4_ = 0;
          auVar56 = vrcpss_avx(auVar58,auVar58);
          iVar33 = swidth * 2 + -2;
          uVar40 = x0 + 1;
          if (x0 + 1 < uVar36) {
            uVar40 = uVar36;
          }
          auVar102 = vpshufd_avx(ZEXT416(x0),0);
          auVar57 = vpaddd_avx(auVar102,_DAT_01f7fcf0);
          auVar102 = vpaddd_avx(auVar102,_DAT_01fafea0);
          auVar113 = vpshufd_avx(ZEXT416((uVar40 - x0) - 1),0);
          auVar123 = vpshufd_avx(ZEXT416(uVar43),0);
          auVar56 = ZEXT416((uint)(auVar56._0_4_ * (2.0 - auVar56._0_4_ * auVar58._0_4_)));
          auVar56 = vshufps_avx(auVar56,auVar56,0);
          in_ZMM3 = ZEXT3264(CONCAT1616(auVar56,auVar56));
          lVar37 = 0;
          in_ZMM4 = ZEXT3264(_DAT_01fe9900);
          auVar86._8_4_ = 1;
          auVar86._0_8_ = 0x100000001;
          auVar86._12_4_ = 1;
          auVar92._8_4_ = 8;
          auVar92._0_8_ = 0x800000008;
          auVar92._12_4_ = 8;
          do {
            auVar100 = vpshufd_avx(ZEXT416((uint)lVar37),0);
            auVar105._16_16_ = auVar100;
            auVar105._0_16_ = auVar100;
            auVar104 = vorps_avx(auVar105,auVar11);
            auVar103 = auVar104._0_16_;
            auVar100 = vpminud_avx(auVar103,auVar113);
            auVar129 = vpcmpeqd_avx(auVar103,auVar100);
            auVar119 = ZEXT1632(auVar129);
            auVar100 = vpaddd_avx(auVar57,auVar57);
            auVar110 = vpaddd_avx(auVar102,auVar102);
            auVar110 = vpor_avx(auVar110,auVar86);
            auVar110 = vpmulld_avx(auVar110,auVar123);
            auVar100 = vpor_avx(auVar100,auVar86);
            auVar100 = vpmulld_avx(auVar100,auVar123);
            if ((auVar129 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar119 = ZEXT432((uint)(auVar100._0_4_ / iVar33));
            }
            auVar129 = vpminud_avx(auVar103,auVar113);
            auVar129 = vpcmpeqd_avx(auVar103,auVar129);
            if ((auVar129 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar129 = vpinsrd_avx(auVar119._0_16_,auVar100._4_4_ / iVar33,1);
              auVar119 = vblendps_avx(auVar119,ZEXT1632(auVar129),0xf);
            }
            auVar129 = vpminud_avx(auVar103,auVar113);
            auVar129 = vpcmpeqd_avx(auVar103,auVar129);
            if ((auVar129 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar129 = vpinsrd_avx(auVar119._0_16_,auVar100._8_4_ / iVar33,2);
              auVar119 = vblendps_avx(auVar119,ZEXT1632(auVar129),0xf);
            }
            auVar129 = vpminud_avx(auVar103,auVar113);
            auVar129 = vpcmpeqd_avx(auVar103,auVar129);
            if ((auVar129 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar100 = vpinsrd_avx(auVar119._0_16_,auVar100._12_4_ / iVar33,3);
              auVar119 = vblendps_avx(auVar119,ZEXT1632(auVar100),0xf);
            }
            auVar100 = vpminud_avx(auVar104._16_16_,auVar113);
            auVar100 = vpcmpeqd_avx(auVar104._16_16_,auVar100);
            if ((auVar100 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar129 = vpinsrd_avx(auVar119._16_16_,auVar110._0_4_ / iVar33,0);
              auVar119._16_16_ = auVar129;
            }
            if ((auVar100 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              iVar29 = vextractps_avx(auVar110,1);
              auVar129 = vpinsrd_avx(auVar119._16_16_,iVar29 / iVar33,1);
              auVar119._16_16_ = auVar129;
            }
            if ((auVar100 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              iVar29 = vextractps_avx(auVar110,2);
              auVar129 = vpinsrd_avx(auVar119._16_16_,iVar29 / iVar33,2);
              auVar119._16_16_ = auVar129;
            }
            if ((auVar100 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              iVar29 = vextractps_avx(auVar110,3);
              auVar110 = vpinsrd_avx(auVar119._16_16_,iVar29 / iVar33,3);
              auVar119._16_16_ = auVar110;
            }
            auVar110 = vpminud_avx(auVar103,auVar113);
            auVar110 = vpcmpeqd_avx(auVar103,auVar110);
            auVar106._16_16_ = auVar100;
            auVar106._0_16_ = auVar110;
            auVar104 = vcvtdq2ps_avx(auVar119);
            auVar18._4_4_ = auVar104._4_4_ * auVar56._4_4_;
            auVar18._0_4_ = auVar104._0_4_ * auVar56._0_4_;
            auVar18._8_4_ = auVar104._8_4_ * auVar56._8_4_;
            auVar18._12_4_ = auVar104._12_4_ * auVar56._12_4_;
            auVar18._16_4_ = auVar104._16_4_ * auVar56._0_4_;
            auVar18._20_4_ = auVar104._20_4_ * auVar56._4_4_;
            auVar18._24_4_ = auVar104._24_4_ * auVar56._8_4_;
            auVar18._28_4_ = auVar104._28_4_;
            auVar104 = vmaskmovps_avx(auVar106,auVar18);
            *(undefined1 (*) [32])(grid_u + lVar37) = auVar104;
            auVar102 = vpaddd_avx(auVar102,auVar92);
            auVar57 = vpaddd_avx(auVar57,auVar92);
            lVar37 = lVar37 + 8;
          } while (((uVar40 - x0) + 7 & 0xfffffff8) != (uint)lVar37);
        }
        if (swidth - 1 == x1) {
          grid_u[uVar35] = 1.0;
        }
      }
      auVar11 = _DAT_01fe9900;
      iVar33 = (int)(long)fVar76;
      if (uVar28 + 1 < swidth && y1 + 1 == sheight) {
        if (x0 <= x1) {
          auVar59._0_4_ = (float)((long)fVar79 & 0xffffffff);
          auVar59._4_8_ = SUB128(ZEXT812(0),4);
          auVar59._12_4_ = 0;
          auVar56 = vrcpss_avx(auVar59,auVar59);
          iVar29 = swidth * 2 + -2;
          uVar43 = x0 + 1;
          if (x0 + 1 < uVar36) {
            uVar43 = uVar36;
          }
          auVar102 = vpshufd_avx(ZEXT416(x0),0);
          auVar57 = vpaddd_avx(auVar102,_DAT_01f7fcf0);
          auVar102 = vpaddd_avx(auVar102,_DAT_01fafea0);
          auVar113 = vpshufd_avx(ZEXT416((uVar43 - x0) - 1),0);
          auVar123 = vpshufd_avx(ZEXT416(uVar28),0);
          auVar56 = ZEXT416((uint)(auVar56._0_4_ * (2.0 - auVar56._0_4_ * auVar59._0_4_)));
          auVar56 = vshufps_avx(auVar56,auVar56,0);
          in_ZMM3 = ZEXT3264(CONCAT1616(auVar56,auVar56));
          lVar37 = 0;
          in_ZMM4 = ZEXT3264(_DAT_01fe9900);
          auVar87._8_4_ = 1;
          auVar87._0_8_ = 0x100000001;
          auVar87._12_4_ = 1;
          auVar93._8_4_ = 8;
          auVar93._0_8_ = 0x800000008;
          auVar93._12_4_ = 8;
          do {
            auVar100 = vpshufd_avx(ZEXT416((uint)lVar37),0);
            auVar107._16_16_ = auVar100;
            auVar107._0_16_ = auVar100;
            auVar104 = vorps_avx(auVar107,auVar11);
            auVar103 = auVar104._0_16_;
            auVar100 = vpminud_avx(auVar103,auVar113);
            auVar129 = vpcmpeqd_avx(auVar103,auVar100);
            auVar120 = ZEXT1632(auVar129);
            auVar100 = vpaddd_avx(auVar57,auVar57);
            auVar110 = vpaddd_avx(auVar102,auVar102);
            auVar110 = vpor_avx(auVar110,auVar87);
            auVar110 = vpmulld_avx(auVar110,auVar123);
            auVar100 = vpor_avx(auVar100,auVar87);
            auVar100 = vpmulld_avx(auVar100,auVar123);
            if ((auVar129 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar120 = ZEXT432((uint)(auVar100._0_4_ / iVar29));
            }
            auVar129 = vpminud_avx(auVar103,auVar113);
            auVar129 = vpcmpeqd_avx(auVar103,auVar129);
            if ((auVar129 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar129 = vpinsrd_avx(auVar120._0_16_,auVar100._4_4_ / iVar29,1);
              auVar120 = vblendps_avx(auVar120,ZEXT1632(auVar129),0xf);
            }
            auVar129 = vpminud_avx(auVar103,auVar113);
            auVar129 = vpcmpeqd_avx(auVar103,auVar129);
            if ((auVar129 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar129 = vpinsrd_avx(auVar120._0_16_,auVar100._8_4_ / iVar29,2);
              auVar120 = vblendps_avx(auVar120,ZEXT1632(auVar129),0xf);
            }
            auVar129 = vpminud_avx(auVar103,auVar113);
            auVar129 = vpcmpeqd_avx(auVar103,auVar129);
            if ((auVar129 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar100 = vpinsrd_avx(auVar120._0_16_,auVar100._12_4_ / iVar29,3);
              auVar120 = vblendps_avx(auVar120,ZEXT1632(auVar100),0xf);
            }
            auVar100 = vpminud_avx(auVar104._16_16_,auVar113);
            auVar100 = vpcmpeqd_avx(auVar104._16_16_,auVar100);
            if ((auVar100 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar129 = vpinsrd_avx(auVar120._16_16_,auVar110._0_4_ / iVar29,0);
              auVar120._16_16_ = auVar129;
            }
            if ((auVar100 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              iVar34 = vextractps_avx(auVar110,1);
              auVar129 = vpinsrd_avx(auVar120._16_16_,iVar34 / iVar29,1);
              auVar120._16_16_ = auVar129;
            }
            if ((auVar100 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              iVar34 = vextractps_avx(auVar110,2);
              auVar129 = vpinsrd_avx(auVar120._16_16_,iVar34 / iVar29,2);
              auVar120._16_16_ = auVar129;
            }
            if ((auVar100 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              iVar34 = vextractps_avx(auVar110,3);
              auVar110 = vpinsrd_avx(auVar120._16_16_,iVar34 / iVar29,3);
              auVar120._16_16_ = auVar110;
            }
            auVar110 = vpminud_avx(auVar103,auVar113);
            auVar110 = vpcmpeqd_avx(auVar103,auVar110);
            auVar108._16_16_ = auVar100;
            auVar108._0_16_ = auVar110;
            auVar104 = vcvtdq2ps_avx(auVar120);
            auVar19._4_4_ = auVar104._4_4_ * auVar56._4_4_;
            auVar19._0_4_ = auVar104._0_4_ * auVar56._0_4_;
            auVar19._8_4_ = auVar104._8_4_ * auVar56._8_4_;
            auVar19._12_4_ = auVar104._12_4_ * auVar56._12_4_;
            auVar19._16_4_ = auVar104._16_4_ * auVar56._0_4_;
            auVar19._20_4_ = auVar104._20_4_ * auVar56._4_4_;
            auVar19._24_4_ = auVar104._24_4_ * auVar56._8_4_;
            auVar19._28_4_ = auVar104._28_4_;
            auVar104 = vmaskmovps_avx(auVar108,auVar19);
            *(undefined1 (*) [32])(grid_u + (ulong)(iVar39 * dwidth) + lVar37) = auVar104;
            auVar102 = vpaddd_avx(auVar102,auVar93);
            auVar57 = vpaddd_avx(auVar57,auVar93);
            lVar37 = lVar37 + 8;
          } while (((uVar43 - x0) + 7 & 0xfffffff8) != (uint)lVar37);
        }
        if (swidth - 1 == x1) {
          grid_u[(ulong)(iVar39 * dwidth) + (ulong)uVar35] = 1.0;
        }
      }
      iVar29 = (int)(long)fVar80;
      if (iVar33 + 1U < sheight && x0 == 0) {
        if (y0 <= y1) {
          auVar60._0_4_ = (float)((long)fVar76 & 0xffffffff);
          auVar60._4_8_ = SUB128(ZEXT812(0),4);
          auVar60._12_4_ = 0;
          auVar56 = vrcpss_avx(auVar60,auVar60);
          iVar34 = (y0 * 2 + 1) * iVar33;
          uVar30 = 0;
          uVar43 = y0;
          do {
            in_ZMM3 = ZEXT1264(ZEXT812(0));
            grid_v[uVar35 + uVar30] =
                 auVar56._0_4_ * (2.0 - auVar56._0_4_ * auVar60._0_4_) *
                 (float)(iVar34 / (int)(sheight * 2 + -2));
            uVar43 = uVar43 + 1;
            uVar30 = (ulong)((int)uVar30 + dwidth);
            iVar34 = iVar34 + iVar33 * 2;
          } while (uVar43 <= y1);
        }
        if (sheight - 1 == y1) {
          grid_v[(ulong)uVar35 + (ulong)(iVar39 * dwidth)] = 1.0;
        }
      }
      if (iVar29 + 1U < sheight && uVar36 == swidth) {
        if (y0 <= y1) {
          auVar55._0_4_ = (float)((long)fVar80 & 0xffffffff);
          auVar55._4_8_ = SUB128(ZEXT812(0),4);
          auVar55._12_4_ = 0;
          auVar56 = vrcpss_avx(auVar55,auVar55);
          iVar33 = (y0 * 2 + 1) * iVar29;
          uVar30 = 0;
          do {
            in_ZMM3 = ZEXT1264(ZEXT812(0));
            grid_v[uVar30] =
                 auVar56._0_4_ * (2.0 - auVar56._0_4_ * auVar55._0_4_) *
                 (float)(iVar33 / (int)(sheight * 2 + -2));
            y0 = y0 + 1;
            uVar30 = (ulong)((int)uVar30 + dwidth);
            iVar33 = iVar33 + iVar29 * 2;
          } while (y0 <= y1);
        }
        if (sheight - 1 == y1) {
          grid_v[iVar39 * dwidth] = 1.0;
        }
      }
    }
    if (7 < uVar45) {
      lVar37 = 0;
      do {
        puVar2 = (undefined8 *)((long)grid_u + lVar37);
        local_10c0[0]._0_8_ = *puVar2;
        local_10c0[0]._8_8_ = puVar2[1];
        local_10c0[0]._16_8_ = puVar2[2];
        local_10c0[0]._24_8_ = puVar2[3];
        puVar2 = (undefined8 *)((long)grid_v + lVar37);
        local_4de0._0_8_ = *puVar2;
        local_4de0._8_8_ = puVar2[1];
        local_4de0._16_8_ = puVar2[2];
        local_4de0._24_8_ = puVar2[3];
        in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
        in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
        patchEval<embree::vfloat_impl<8>>
                  (patch,(vfloat_impl<8> *)local_10c0,(vfloat_impl<8> *)&local_4de0);
        fVar79 = in_ZMM4._28_4_;
        fVar76 = in_ZMM3._28_4_;
        if (*(long *)&(geom->super_Geometry).field_0x58 != 0) {
          patchNormal<embree::vfloat_impl<8>>
                    (patch,(vfloat_impl<8> *)local_10c0,(vfloat_impl<8> *)&local_4de0);
          auVar23._8_8_ = local_4dc0._8_8_;
          auVar23._0_8_ = local_4dc0._0_8_;
          auVar23._16_4_ = local_4dc0.i[4];
          auVar23._20_4_ = local_4dc0.i[5];
          auVar23._24_8_ = local_4dc0._24_8_;
          auVar24._8_8_ = paStack_4d98;
          auVar24._0_8_ = local_4da0;
          auVar24._16_8_ = puStack_4d90;
          auVar24._24_8_ = pauStack_4d88;
          auVar25._8_8_ = ppfStack_4d78;
          auVar25._0_8_ = local_4d80;
          auVar25._16_8_ = paStack_4d70;
          auVar25._24_4_ = fStack_4d68;
          auVar25._28_4_ = uStack_4d64;
          fVar80 = SUB84(local_4d80,0);
          fVar83 = (float)((ulong)local_4d80 >> 0x20);
          fVar94 = SUB84(ppfStack_4d78,0);
          fVar97 = (float)((ulong)ppfStack_4d78 >> 0x20);
          fVar127 = SUB84(paStack_4d70,0);
          fVar134 = (float)((ulong)paStack_4d70 >> 0x20);
          fVar81 = SUB84(local_4da0,0);
          fVar84 = (float)((ulong)local_4da0 >> 0x20);
          fVar95 = SUB84(paStack_4d98,0);
          fVar98 = (float)((ulong)paStack_4d98 >> 0x20);
          fVar133 = SUB84(puStack_4d90,0);
          fVar135 = (float)((ulong)puStack_4d90 >> 0x20);
          fVar136 = SUB84(pauStack_4d88,0);
          fVar82 = (float)local_4dc0._0_8_;
          fVar91 = (float)((ulong)local_4dc0._0_8_ >> 0x20);
          fVar96 = (float)local_4dc0._8_8_;
          fVar99 = (float)((ulong)local_4dc0._8_8_ >> 0x20);
          fVar137 = (float)local_4dc0._24_8_;
          auVar69._0_4_ = fVar82 * fVar82 + fVar80 * fVar80 + fVar81 * fVar81;
          auVar69._4_4_ = fVar91 * fVar91 + fVar83 * fVar83 + fVar84 * fVar84;
          auVar69._8_4_ = fVar96 * fVar96 + fVar94 * fVar94 + fVar95 * fVar95;
          auVar69._12_4_ = fVar99 * fVar99 + fVar97 * fVar97 + fVar98 * fVar98;
          auVar69._16_4_ = local_4dc0.v[4] * local_4dc0.v[4] + fVar127 * fVar127 + fVar133 * fVar133
          ;
          auVar69._20_4_ = local_4dc0.v[5] * local_4dc0.v[5] + fVar134 * fVar134 + fVar135 * fVar135
          ;
          auVar69._24_4_ = fVar137 * fVar137 + fStack_4d68 * fStack_4d68 + fVar136 * fVar136;
          auVar69._28_4_ = fVar79 + fVar76 + fVar79;
          auVar104 = vrsqrtps_avx(auVar69);
          auVar11 = vcmpps_avx(auVar69,_DAT_01faff00,0);
          fVar76 = auVar104._0_4_;
          fVar79 = auVar104._4_4_;
          fVar71 = auVar104._8_4_;
          fVar72 = auVar104._12_4_;
          fVar73 = auVar104._16_4_;
          fVar74 = auVar104._20_4_;
          fVar75 = auVar104._24_4_;
          fVar76 = fVar76 * 1.5 + fVar76 * fVar76 * fVar76 * auVar69._0_4_ * -0.5;
          fVar79 = fVar79 * 1.5 + fVar79 * fVar79 * fVar79 * auVar69._4_4_ * -0.5;
          fVar71 = fVar71 * 1.5 + fVar71 * fVar71 * fVar71 * auVar69._8_4_ * -0.5;
          fVar72 = fVar72 * 1.5 + fVar72 * fVar72 * fVar72 * auVar69._12_4_ * -0.5;
          fVar73 = fVar73 * 1.5 + fVar73 * fVar73 * fVar73 * auVar69._16_4_ * -0.5;
          fVar74 = fVar74 * 1.5 + fVar74 * fVar74 * fVar74 * auVar69._20_4_ * -0.5;
          fVar75 = fVar75 * 1.5 + fVar75 * fVar75 * fVar75 * auVar69._24_4_ * -0.5;
          auVar77._0_4_ = fVar82 * fVar76;
          auVar77._4_4_ = fVar91 * fVar79;
          auVar77._8_4_ = fVar96 * fVar71;
          auVar77._12_4_ = fVar99 * fVar72;
          auVar15._16_4_ = local_4dc0.v[4] * fVar73;
          auVar15._0_16_ = auVar77;
          auVar15._20_4_ = local_4dc0.v[5] * fVar74;
          auVar15._24_4_ = fVar137 * fVar75;
          auVar15._28_4_ = auVar104._28_4_;
          auVar16._4_4_ = fVar84 * fVar79;
          auVar16._0_4_ = fVar81 * fVar76;
          auVar16._8_4_ = fVar95 * fVar71;
          auVar16._12_4_ = fVar98 * fVar72;
          auVar16._16_4_ = fVar133 * fVar73;
          auVar16._20_4_ = fVar135 * fVar74;
          auVar16._24_4_ = fVar136 * fVar75;
          auVar16._28_4_ = 0x3fc00000;
          auVar66._0_4_ = fVar80 * fVar76;
          auVar66._4_4_ = fVar83 * fVar79;
          auVar66._8_4_ = fVar94 * fVar71;
          auVar66._12_4_ = fVar97 * fVar72;
          auVar17._16_4_ = fVar127 * fVar73;
          auVar17._0_16_ = auVar66;
          auVar17._20_4_ = fVar134 * fVar74;
          auVar17._24_4_ = fStack_4d68 * fVar75;
          auVar17._28_4_ = auVar69._28_4_ + 1.5;
          local_3d80 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                       vblendvps_avx(auVar15,auVar23,auVar11);
          local_3d60 = vblendvps_avx(auVar16,auVar24,auVar11);
          local_3d40[0] = vblendvps_avx(auVar17,auVar25,auVar11);
          local_4dc0._0_8_ = (geom->super_Geometry).userPtr;
          local_4dc0._8_8_ = geom;
          local_4dc0.v[4] = (float)patch->prim;
          local_4dc0.v[5] = (float)patch->time_;
          local_4dc0._24_8_ = local_10c0;
          paStack_4d98 = &local_3d80;
          puStack_4d90 = local_3d60;
          pauStack_4d88 = local_3d40;
          local_4d80 = &local_2d40;
          ppfStack_4d78 = &local_2d20;
          paStack_4d70 = &local_2d00;
          fStack_4d68 = 1.12104e-44;
          in_ZMM3 = ZEXT1664(auVar66);
          in_ZMM4 = ZEXT1664(auVar77);
          local_4da0 = &local_4de0;
          (**(code **)&(geom->super_Geometry).field_0x58)(&local_4dc0);
        }
        puVar2 = (undefined8 *)((long)grid_x + lVar37);
        *puVar2 = local_2d40._0_8_;
        puVar2[1] = local_2d40._8_8_;
        puVar2[2] = CONCAT44(uStack_2d2c,uStack_2d30);
        puVar2[3] = pfStack_2d28;
        puVar2 = (undefined8 *)((long)grid_y + lVar37);
        *puVar2 = local_2d20;
        puVar2[1] = paStack_2d18;
        puVar2[2] = paStack_2d10;
        puVar2[3] = paStack_2d08;
        puVar2 = (undefined8 *)((long)grid_z + lVar37);
        *puVar2 = local_2d00._0_8_;
        puVar2[1] = local_2d00._8_8_;
        puVar2[2] = pfStack_2cf0;
        puVar2[3] = CONCAT44(uStack_2ce4,uStack_2ce8);
        lVar37 = lVar37 + 0x20;
      } while ((ulong)(uVar50 + (uVar50 == 0)) << 5 != lVar37);
    }
  }
  return;
}

Assistant:

void evalGrid(const SubdivPatch1Base& patch,
                  const unsigned x0, const unsigned x1,
                  const unsigned y0, const unsigned y1,
                  const unsigned swidth, const unsigned sheight,
                  float *__restrict__ const grid_x,
                  float *__restrict__ const grid_y,
                  float *__restrict__ const grid_z,
                  float *__restrict__ const grid_u,
                  float *__restrict__ const grid_v,
                  const SubdivMesh* const geom)
    {
      const unsigned dwidth  = x1-x0+1;
      const unsigned dheight = y1-y0+1;
      const unsigned M = dwidth*dheight+VSIZEX;
      const unsigned grid_size_simd_blocks = (M-1)/VSIZEX;

      if (unlikely(patch.type == SubdivPatch1Base::EVAL_PATCH))
      {
        const bool displ = geom->displFunc;
        const unsigned N = displ ? M : 0;
        dynamic_large_stack_array(float,grid_Ng_x,N,32*32*sizeof(float));
        dynamic_large_stack_array(float,grid_Ng_y,N,32*32*sizeof(float));
        dynamic_large_stack_array(float,grid_Ng_z,N,32*32*sizeof(float));
        
        if (geom->patch_eval_trees.size())
        {
          feature_adaptive_eval_grid<PatchEvalGrid> 
            (geom->patch_eval_trees[geom->numTimeSteps*patch.primID()+patch.time()], patch.subPatch(), patch.needsStitching() ? patch.level : nullptr,
             x0,x1,y0,y1,swidth,sheight,
             grid_x,grid_y,grid_z,grid_u,grid_v,
             displ ? (float*)grid_Ng_x : nullptr, displ ? (float*)grid_Ng_y : nullptr, displ ? (float*)grid_Ng_z : nullptr,
             dwidth,dheight);
        }
        else 
        {
          GeneralCatmullClarkPatch3fa ccpatch(patch.edge(),geom->getVertexBuffer(patch.time()));
          
          feature_adaptive_eval_grid<FeatureAdaptiveEvalGrid,GeneralCatmullClarkPatch3fa> 
            (ccpatch, patch.subPatch(), patch.needsStitching() ? patch.level : nullptr,
            x0,x1,y0,y1,swidth,sheight,
            grid_x,grid_y,grid_z,grid_u,grid_v,
            displ ? (float*)grid_Ng_x : nullptr, displ ? (float*)grid_Ng_y : nullptr, displ ? (float*)grid_Ng_z : nullptr,
            dwidth,dheight);
        }

        /* convert sub-patch UVs to patch UVs*/
        const Vec2f uv0 = patch.getUV(0);
        const Vec2f uv1 = patch.getUV(1);
        const Vec2f uv2 = patch.getUV(2);
        const Vec2f uv3 = patch.getUV(3);
        for (unsigned i=0; i<grid_size_simd_blocks; i++)
        {
          const vfloatx u = vfloatx::load(&grid_u[i*VSIZEX]);
          const vfloatx v = vfloatx::load(&grid_v[i*VSIZEX]);
          const vfloatx patch_u = lerp2(uv0.x,uv1.x,uv3.x,uv2.x,u,v);
          const vfloatx patch_v = lerp2(uv0.y,uv1.y,uv3.y,uv2.y,u,v);
          vfloatx::store(&grid_u[i*VSIZEX],patch_u);
          vfloatx::store(&grid_v[i*VSIZEX],patch_v);
        }

        /* call displacement shader */
        if (unlikely(geom->displFunc)) {
          RTCDisplacementFunctionNArguments args;
          args.geometryUserPtr = geom->userPtr;
          args.geometry = (RTCGeometry)geom;
          //args.geomID = patch.geomID();
          args.primID = patch.primID();
          args.timeStep = patch.time();
          args.u = grid_u;
          args.v = grid_v;
          args.Ng_x = grid_Ng_x;
          args.Ng_y = grid_Ng_y;
          args.Ng_z = grid_Ng_z;
          args.P_x = grid_x;
          args.P_y = grid_y;
          args.P_z = grid_z;
          args.N = dwidth*dheight;
          geom->displFunc(&args);
        }

        /* set last elements in u,v array to 1.0f */
        const float last_u = grid_u[dwidth*dheight-1];
        const float last_v = grid_v[dwidth*dheight-1];
        const float last_x = grid_x[dwidth*dheight-1];
        const float last_y = grid_y[dwidth*dheight-1];
        const float last_z = grid_z[dwidth*dheight-1];
        for (unsigned i=dwidth*dheight;i<grid_size_simd_blocks*VSIZEX;i++)
        {
          grid_u[i] = last_u;
          grid_v[i] = last_v;
          grid_x[i] = last_x;
          grid_y[i] = last_y;
          grid_z[i] = last_z;
        }
      }
      else
      {
        /* grid_u, grid_v need to be padded as we write with SIMD granularity */
        gridUVTessellator(patch.level,swidth,sheight,x0,y0,dwidth,dheight,grid_u,grid_v);
      
        /* set last elements in u,v array to last valid point */
        const float last_u = grid_u[dwidth*dheight-1];
        const float last_v = grid_v[dwidth*dheight-1];
        for (unsigned i=dwidth*dheight;i<grid_size_simd_blocks*VSIZEX;i++) {
          grid_u[i] = last_u;
          grid_v[i] = last_v;
        }

        /* stitch edges if necessary */
        if (unlikely(patch.needsStitching()))
          stitchUVGrid(patch.level,swidth,sheight,x0,y0,dwidth,dheight,grid_u,grid_v);
      
        /* iterates over all grid points */
        for (unsigned i=0; i<grid_size_simd_blocks; i++)
        {
          const vfloatx u = vfloatx::load(&grid_u[i*VSIZEX]);
          const vfloatx v = vfloatx::load(&grid_v[i*VSIZEX]);
          Vec3vfx vtx = patchEval(patch,u,v);
        
          /* evaluate displacement function */
          if (unlikely(geom->displFunc != nullptr))
          {
            const Vec3vfx normal = normalize_safe(patchNormal(patch, u, v));
            RTCDisplacementFunctionNArguments args;
            args.geometryUserPtr = geom->userPtr;
            args.geometry = (RTCGeometry)geom;
            //args.geomID = patch.geomID();
            args.primID = patch.primID();
            args.timeStep = patch.time();
            args.u = &u[0];
            args.v = &v[0];
            args.Ng_x = &normal.x[0];
            args.Ng_y = &normal.y[0];
            args.Ng_z = &normal.z[0];
            args.P_x = &vtx.x[0];
            args.P_y = &vtx.y[0];
            args.P_z = &vtx.z[0];
            args.N = VSIZEX;
            geom->displFunc(&args);
          }

          vfloatx::store(&grid_x[i*VSIZEX],vtx.x);
          vfloatx::store(&grid_y[i*VSIZEX],vtx.y);
          vfloatx::store(&grid_z[i*VSIZEX],vtx.z);
        }
      }
    }